

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAxisForceTorqueContactSensor.cpp
# Opt level: O3

string * __thiscall
iDynTree::ThreeAxisForceTorqueContactSensor::getName_abi_cxx11_
          (string *__return_storage_ptr__,ThreeAxisForceTorqueContactSensor *this)

{
  ThreeAxisForceTorqueContactSensorPrivateAttributes *pTVar1;
  pointer pcVar2;
  
  pTVar1 = this->pimpl;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pTVar1->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pTVar1->name)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string ThreeAxisForceTorqueContactSensor::getName() const
{
    return this->pimpl->name;
}